

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *
kj::parse::
Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
::
Impl<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
::apply(Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
        *__return_storage_ptr__,
       ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
       *subParser,
       IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *input)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar5;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar6;
  size_t newSize;
  Results results;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> _subResult425;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  subInput;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_e8;
  char local_c8;
  OrphanBuilder local_c0;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *local_a0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_98;
  Reader *local_88;
  undefined8 uStack_80;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_78;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *local_68;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *local_60;
  char local_58 [8];
  OrphanBuilder local_50;
  
  local_e8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_60 = &input->end;
  local_68 = __return_storage_ptr__;
  do {
    if ((input->pos).index == (input->end).index) break;
    local_98.container = (input->pos).container;
    local_98.index = (input->pos).index;
    local_98._12_4_ = *(undefined4 *)&(input->pos).field_0xc;
    local_88 = local_60->container;
    uStack_80 = *(undefined8 *)&local_60->index;
    local_78.container._0_4_ = *(undefined4 *)&(input->pos).container;
    local_78.container._4_4_ = *(undefined4 *)((long)&(input->pos).container + 4);
    local_78.index = (input->pos).index;
    local_78._12_4_ = *(undefined4 *)&(input->pos).field_0xc;
    local_a0 = input;
    (*(code *)**(undefined8 **)subParser->wrapper)
              (local_58,subParser->wrapper,subParser->parser,&local_a0);
    local_c8 = local_58[0];
    if (local_58[0] == '\x01') {
      local_c0.capTable = local_50.capTable;
      local_c0.location = local_50.location;
      local_c0.tag.content = local_50.tag.content;
      local_c0.segment = local_50.segment;
      local_50.segment = (SegmentBuilder *)0x0;
      local_50.location = (word *)0x0;
    }
    if ((local_58[0] != '\0') && (local_50.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_50);
    }
    cVar4 = local_c8;
    if (local_c8 == '\x01') {
      (local_a0->pos).index = local_98.index;
      (local_a0->pos).container = local_98.container;
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        newSize = (long)local_e8.builder.endPtr - (long)local_e8.builder.ptr >> 4;
        if (local_e8.builder.endPtr == local_e8.builder.ptr) {
          newSize = 4;
        }
        Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::setCapacity
                  (&local_e8,newSize);
      }
      ((local_e8.builder.pos)->builder).segment = local_c0.segment;
      ((local_e8.builder.pos)->builder).capTable = local_c0.capTable;
      ((local_e8.builder.pos)->builder).location = local_c0.location;
      ((local_e8.builder.pos)->builder).tag.content = local_c0.tag.content;
      local_c0.segment = (SegmentBuilder *)0x0;
      local_c0.location = (word *)0x0;
      local_e8.builder.pos = local_e8.builder.pos + 1;
    }
    if ((local_c8 == '\x01') && (local_c0.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_c0);
    }
    if (local_a0 !=
        (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
         *)0x0) {
      pIVar5 = &local_98;
      if (local_98.index <= local_78.index) {
        pIVar5 = &local_78;
      }
      uVar1 = (&local_98)[(ulong)(local_98.index <= local_78.index) * 2].index;
      uVar2 = (local_a0->best).index;
      uVar3 = uVar2;
      if (uVar2 < uVar1) {
        uVar3 = uVar1;
      }
      pIVar6 = &local_a0->best;
      if (uVar2 < uVar1) {
        pIVar6 = pIVar5;
      }
      (local_a0->best).container = pIVar6->container;
      (local_a0->best).index = uVar3;
    }
  } while (cVar4 != '\0');
  if (local_e8.builder.pos != local_e8.builder.endPtr) {
    Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::setCapacity
              (&local_e8,(long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 5);
  }
  (local_68->ptr).isSet = true;
  (local_68->ptr).field_1.value.ptr = local_e8.builder.ptr;
  (local_68->ptr).field_1.value.size_ = (long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 5
  ;
  (local_68->ptr).field_1.value.disposer = local_e8.builder.disposer;
  return local_68;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }